

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O2

void p_list_free(PList *list)

{
  PList *pPVar1;
  
  if (list != (PList *)0x0) {
    while (list != (PList *)0x0) {
      pPVar1 = list->next;
      p_free(list);
      list = pPVar1;
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_list_free (PList *list)
{
	PList *cur;
	PList *next;

	if (P_UNLIKELY (list == NULL))
		return;

	for (next = cur = list; cur != NULL && next != NULL; cur = next)  {
		next = cur->next;
		p_free (cur);
	}
}